

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentId::ON_SubDComponentId(ON_SubDComponentId *this,ON_SubDComponentPtr cptr)

{
  Type type;
  ON_SubDComponentBase *pOVar1;
  ON__UINT_PTR OVar2;
  ON_SubDComponentId *local_28;
  ON_SubDComponentBase *b;
  ON_SubDComponentId *this_local;
  ON_SubDComponentPtr cptr_local;
  
  this->m_id = 0;
  this->m_type_and_dir = '\0';
  local_28 = (ON_SubDComponentId *)this->m_valueAB;
  do {
    *(uchar *)&local_28->m_id = '\0';
    local_28 = (ON_SubDComponentId *)((long)&local_28->m_id + 1);
  } while (local_28 != this + 1);
  this_local = (ON_SubDComponentId *)cptr.m_ptr;
  pOVar1 = ON_SubDComponentPtr::ComponentBase((ON_SubDComponentPtr *)&this_local);
  if (pOVar1 != (ON_SubDComponentBase *)0x0) {
    this->m_id = pOVar1->m_id;
    type = ON_SubDComponentPtr::ComponentType((ON_SubDComponentPtr *)&this_local);
    Internal_SetType(this,type);
    OVar2 = ON_SubDComponentPtr::ComponentDirection((ON_SubDComponentPtr *)&this_local);
    Internal_SetDir(this,(uint)(OVar2 != 0));
  }
  return;
}

Assistant:

ON_SubDComponentId::ON_SubDComponentId(ON_SubDComponentPtr cptr)
{
  const ON_SubDComponentBase* b = cptr.ComponentBase();
  if (nullptr != b)
  {
    m_id = b->m_id;
    Internal_SetType(cptr.ComponentType());
    Internal_SetDir(0 == cptr.ComponentDirection() ? 0u : 1u);
  }
}